

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gb.c
# Opt level: O3

void device_reset_gameboy_sound(void *chip)

{
  byte bVar1;
  gb_sound_t *gb;
  byte bVar2;
  byte bVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  
  bVar1 = *(byte *)((long)chip + 0x3e);
  bVar3 = *(char *)((long)chip + 0x72) * '\x02' | bVar1;
  bVar2 = *(char *)((long)chip + 0xda) << 3 | *(char *)((long)chip + 0xa6) << 2 | bVar3;
  *(undefined8 *)((long)chip + 0x128) = 0;
  memset((void *)((long)chip + 0xc),0,0xd0);
  *(byte *)((long)chip + 0x3e) = bVar1 & 1;
  *(byte *)((long)chip + 0x72) = bVar3 >> 1 & 1;
  *(byte *)((long)chip + 0xa6) = bVar2 >> 2 & 1;
  *(byte *)((long)chip + 0xda) = bVar2 >> 3 & 1;
  *(undefined1 *)((long)chip + 0x12) = 1;
  *(undefined1 *)((long)chip + 0x14) = 0x3f;
  *(undefined1 *)((long)chip + 0x46) = 2;
  *(undefined1 *)((long)chip + 0x48) = 0x3f;
  *(undefined1 *)((long)chip + 0x7a) = 3;
  *(undefined1 *)((long)chip + 0x7c) = 0xff;
  *(undefined1 *)((long)chip + 0xae) = 4;
  *(undefined1 *)((long)chip + 0xb0) = 0x3f;
  gb_sound_w_internal((gb_sound_t *)chip,'\x16','\0');
  if (*(char *)((long)chip + 0x130) == '\0') {
    uVar4 = 0x48daddac;
    uVar5 = 0x16cf0236;
    uVar6 = 0x2ce5042c;
    uVar7 = 0x48daddac;
  }
  else {
    if (*(char *)((long)chip + 0x130) != '\x01') {
      return;
    }
    uVar4 = 0xff00ff00;
    uVar5 = 0xff00ff00;
    uVar6 = 0xff00ff00;
    uVar7 = 0xff00ff00;
  }
  *(undefined4 *)((long)chip + 0x110) = uVar4;
  *(undefined4 *)((long)chip + 0x114) = uVar5;
  *(undefined4 *)((long)chip + 0x118) = uVar6;
  *(undefined4 *)((long)chip + 0x11c) = uVar7;
  return;
}

Assistant:

static void device_reset_gameboy_sound(void *chip)
{
	gb_sound_t *gb = (gb_sound_t *)chip;
	UINT32 muteMask;

	muteMask = gameboy_sound_get_mute_mask(gb);

	RC_RESET(&gb->cycleCntr);

	memset(&gb->snd_1, 0, sizeof(gb->snd_1));
	memset(&gb->snd_2, 0, sizeof(gb->snd_2));
	memset(&gb->snd_3, 0, sizeof(gb->snd_3));
	memset(&gb->snd_4, 0, sizeof(gb->snd_4));

	gameboy_sound_set_mute_mask(gb, muteMask);

	gb->snd_1.channel = 1;
	gb->snd_1.length_mask = 0x3F;
	gb->snd_2.channel = 2;
	gb->snd_2.length_mask = 0x3F;
	gb->snd_3.channel = 3;
	gb->snd_3.length_mask = 0xFF;
	gb->snd_4.channel = 4;
	gb->snd_4.length_mask = 0x3F;

	gb_sound_w_internal(gb, NR52, 0x00);
	switch(gb->gbMode)
	{
	case GBMODE_DMG:
		gb->snd_regs[AUD3W0] = 0xac;
		gb->snd_regs[AUD3W1] = 0xdd;
		gb->snd_regs[AUD3W2] = 0xda;
		gb->snd_regs[AUD3W3] = 0x48;
		gb->snd_regs[AUD3W4] = 0x36;
		gb->snd_regs[AUD3W5] = 0x02;
		gb->snd_regs[AUD3W6] = 0xcf;
		gb->snd_regs[AUD3W7] = 0x16;
		gb->snd_regs[AUD3W8] = 0x2c;
		gb->snd_regs[AUD3W9] = 0x04;
		gb->snd_regs[AUD3WA] = 0xe5;
		gb->snd_regs[AUD3WB] = 0x2c;
		gb->snd_regs[AUD3WC] = 0xac;
		gb->snd_regs[AUD3WD] = 0xdd;
		gb->snd_regs[AUD3WE] = 0xda;
		gb->snd_regs[AUD3WF] = 0x48;
		break;
	case GBMODE_CGB04:
		gb->snd_regs[AUD3W0] = 0x00;
		gb->snd_regs[AUD3W1] = 0xFF;
		gb->snd_regs[AUD3W2] = 0x00;
		gb->snd_regs[AUD3W3] = 0xFF;
		gb->snd_regs[AUD3W4] = 0x00;
		gb->snd_regs[AUD3W5] = 0xFF;
		gb->snd_regs[AUD3W6] = 0x00;
		gb->snd_regs[AUD3W7] = 0xFF;
		gb->snd_regs[AUD3W8] = 0x00;
		gb->snd_regs[AUD3W9] = 0xFF;
		gb->snd_regs[AUD3WA] = 0x00;
		gb->snd_regs[AUD3WB] = 0xFF;
		gb->snd_regs[AUD3WC] = 0x00;
		gb->snd_regs[AUD3WD] = 0xFF;
		gb->snd_regs[AUD3WE] = 0x00;
		gb->snd_regs[AUD3WF] = 0xFF;
		break;
	}

	return;
}